

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_get_in_many_string_key(planck_unit_test_t *tc)

{
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  char local_98 [16];
  ion_dictionary_t local_88;
  ion_dictionary_handler_t local_70;
  
  local_98[8] = 0;
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  bhdct_setup_string_key(tc,&local_70,&local_88,ion_fill_none);
  sprintf(local_98,"k%d",0x23);
  local_9c = 0x46;
  bhdct_insert(tc,&local_88,local_98,&local_9c,'\x01');
  sprintf(local_98,"k%d",0x3ea);
  local_a0 = 0x7d4;
  bhdct_insert(tc,&local_88,local_98,&local_a0,'\x01');
  sprintf(local_98,"k%d",0x37);
  local_a4 = 0x6e;
  bhdct_insert(tc,&local_88,local_98,&local_a4,'\x01');
  sprintf(local_98,"k%d",0xfffffffb);
  local_a8 = 0xfffffff6;
  bhdct_insert(tc,&local_88,local_98,&local_a8,'\x01');
  bhdct_delete_dictionary(tc,&local_88);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_in_many_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 35);
	bhdct_insert(tc, &dict, key, IONIZE(35 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 1002);
	bhdct_insert(tc, &dict, key, IONIZE(1002 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 55);
	bhdct_insert(tc, &dict, key, IONIZE(55 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, -5);
	bhdct_insert(tc, &dict, key, IONIZE(-5 * 2, int), boolean_true);

	bhdct_takedown(tc, &dict);
}